

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O1

void __thiscall enact::ReturnStmt::~ReturnStmt(ReturnStmt *this)

{
  ~ReturnStmt(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

~ReturnStmt() override = default;